

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSat.c
# Opt level: O2

int Res_SatAddEqual(sat_solver *pSat,int iVar0,int iVar1,int fCompl)

{
  int iVar2;
  uint uVar3;
  lit Lits [2];
  uint local_30;
  uint local_2c;
  
  local_2c = (uint)(fCompl == 0) + iVar1 * 2;
  local_30 = iVar0 * 2;
  iVar2 = sat_solver_addclause(pSat,(lit *)&local_30,(lit *)&stack0xffffffffffffffd8);
  if (iVar2 == 0) {
    uVar3 = 0;
  }
  else {
    local_30 = iVar0 * 2 | 1;
    local_2c = (uint)(fCompl != 0) | iVar1 * 2;
    iVar2 = sat_solver_addclause(pSat,(lit *)&local_30,(lit *)&stack0xffffffffffffffd8);
    uVar3 = (uint)(iVar2 != 0);
  }
  return uVar3;
}

Assistant:

int Res_SatAddEqual( sat_solver * pSat, int iVar0, int iVar1, int fCompl )
{
    lit Lits[2];

    Lits[0] = toLitCond( iVar0, 0 );
    Lits[1] = toLitCond( iVar1, !fCompl );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 2 ) )
        return 0;

    Lits[0] = toLitCond( iVar0, 1 );
    Lits[1] = toLitCond( iVar1, fCompl );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 2 ) )
        return 0;

    return 1;
}